

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

int Ga2_ManCheckNodesAnd(Gia_Man_t *p,Vec_Int_t *vNodes)

{
  ulong uVar1;
  int v;
  Gia_Obj_t *pGVar2;
  int i;
  
  i = 0;
  do {
    if (vNodes->nSize <= i) {
      return 1;
    }
    v = Vec_IntEntry(vNodes,i);
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      return 1;
    }
    uVar1 = *(ulong *)pGVar2;
    if ((-1 < *(long *)(pGVar2 + -(ulong)((uint)uVar1 & 0x1fffffff)) & (byte)(uVar1 >> 0x1d) & 1) !=
        0) {
      return 0;
    }
    i = i + 1;
  } while (((uVar1 >> 0x3d & 1) == 0) ||
          (*(long *)(pGVar2 + -(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)) < 0));
  return 0;
}

Assistant:

int Ga2_ManCheckNodesAnd( Gia_Man_t * p, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        if ( (!Gia_ObjFanin0(pObj)->fPhase && Gia_ObjFaninC0(pObj)) || 
             (!Gia_ObjFanin1(pObj)->fPhase && Gia_ObjFaninC1(pObj)) )
            return 0;
    return 1;
}